

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O1

ProcessorProperty * __thiscall soul::heart::Parser::parseProcessorProperty(Parser *this)

{
  Module *pMVar1;
  ProcessorProperty *pPVar2;
  Property property;
  CodeLocation pos;
  Property local_b4;
  CodeLocation local_b0;
  string local_a0;
  CompileMessage local_80;
  CompileMessage local_48;
  
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2838bd);
  local_b0.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_b0.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_b0.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_b0.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_b0.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  readGeneralIdentifier_abi_cxx11_(&local_a0,this);
  local_b4 = ProcessorProperty::getPropertyFromName(&local_a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  if (local_b4 == none) {
    CompileMessageHelpers::createMessage<>(&local_48,syntax,error,"Unknown processor property name")
    ;
    CodeLocation::throwError(&local_b0,&local_48);
  }
  pMVar1 = (this->module).object;
  if (pMVar1 == (Module *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  if (pMVar1->moduleType != namespaceModule) {
    pPVar2 = PoolAllocator::
             allocate<soul::heart::ProcessorProperty,soul::CodeLocation&,soul::heart::ProcessorProperty::Property&>
                       (&pMVar1->allocator->pool,&local_b0,&local_b4);
    RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_b0.sourceCode.object);
    return pPVar2;
  }
  CompileMessageHelpers::createMessage<>
            (&local_80,syntax,error,
             "Processor properties are only valid inside a processor declaration");
  CodeLocation::throwError(&local_b0,&local_80);
}

Assistant:

heart::ProcessorProperty& parseProcessorProperty()
    {
        expect (HEARTOperator::dot);
        auto pos = location;
        auto property = heart::ProcessorProperty::getPropertyFromName (readGeneralIdentifier());

        if (property == heart::ProcessorProperty::Property::none)
            pos.throwError (Errors::unknownProperty());

        if (module->isNamespace())
            pos.throwError (Errors::processorPropertyUsedOutsideDecl());

        return module->allocate<heart::ProcessorProperty> (pos, property);
    }